

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorClassifier::SupportVectorClassifier
          (SupportVectorClassifier *this)

{
  SupportVectorClassifier *pSVar1;
  SupportVectorClassifier *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SupportVectorClassifier_00d5d778
  ;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<int>::RepeatedField(&this->numberofsupportvectorsperclass_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::RepeatedPtrField
            (&this->coefficients_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->rho_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->proba_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->probb_);
  SupportVectorsUnion::SupportVectorsUnion((SupportVectorsUnion *)&this->supportVectors_);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  pSVar1 = internal_default_instance();
  if (this != pSVar1) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

SupportVectorClassifier::SupportVectorClassifier()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_SVM_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.SupportVectorClassifier)
}